

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O1

uint32_t helper_mulr_h(uint32_t arg00,uint32_t arg01,uint32_t arg10,uint32_t arg11,uint32_t n)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  
  uVar2 = (arg10 * arg00 << ((byte)n & 0x1f)) + 0x8000 & 0xffff0000;
  uVar4 = (arg11 * arg01 << ((byte)n & 0x1f)) + 0x8000 >> 0x10;
  uVar3 = 0x7fff;
  if ((arg11 & 0xffff) != 0x8000 || (arg01 & 0xffff) != 0x8000) {
    uVar3 = uVar4;
  }
  uVar1 = 0x7fff0000;
  if (n != 1) {
    uVar3 = uVar4;
    uVar1 = uVar2;
  }
  if ((arg10 & 0xffff) != 0x8000 || (arg00 & 0xffff) != 0x8000) {
    uVar1 = uVar2;
  }
  return uVar1 | uVar3;
}

Assistant:

uint32_t helper_mulr_h(uint32_t arg00, uint32_t arg01,
                       uint32_t arg10, uint32_t arg11, uint32_t n)
{
    uint32_t result0, result1;

    int32_t sc1 = ((arg00 & 0xffff) == 0x8000) &&
                  ((arg10 & 0xffff) == 0x8000) && (n == 1);
    int32_t sc0 = ((arg01 & 0xffff) == 0x8000) &&
                  ((arg11 & 0xffff) == 0x8000) && (n == 1);

    if (sc1) {
        result1 = 0x7fffffff;
    } else {
        result1 = ((arg00 * arg10) << n) + 0x8000;
    }
    if (sc0) {
        result0 = 0x7fffffff;
    } else {
        result0 = ((arg01 * arg11) << n) + 0x8000;
    }
    return (result1 & 0xffff0000) | (result0 >> 16);
}